

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O2

mz_bool duckdb_miniz::mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar5;
  void *pvVar6;
  undefined8 uVar7;
  mz_uint n;
  mz_bool mVar8;
  mz_zip_error mVar9;
  size_t sVar10;
  int *piVar11;
  size_t sVar12;
  short *psVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  mz_uint64 mVar19;
  long lVar20;
  ulong uVar21;
  int *pCentral_dir_header;
  short *__src;
  bool bVar22;
  mz_uint64 local_5a8;
  ulong local_598;
  ulong local_590;
  ulong local_588;
  void *local_580;
  void *local_578;
  uint local_564;
  ulong local_560;
  mz_zip_array local_558;
  short *local_530;
  mz_zip_array local_528 [2];
  mz_uint32 local_header_u32 [8];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined4 uStack_4a8;
  undefined4 local_4a4;
  undefined4 uStack_4a0;
  undefined2 uStack_49c;
  undefined2 local_49a;
  undefined6 uStack_498;
  undefined4 uStack_492;
  undefined4 uStack_48e;
  mz_zip_archive_file_stat src_file_stat;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       (pSource_zip->m_pRead == (mz_file_read_func)0x0)) ||
      ((pmVar5 = pSource_zip->m_pState, pmVar5->m_zip64 != 0 && (pArray->m_zip64 == 0)))) ||
     ((pSource_zip->m_total_files <= src_file_index ||
      (pvVar6 = (pmVar5->m_central_dir).m_p, pvVar6 == (void *)0x0)))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pCentral_dir_header =
       (int *)((long)pvVar6 +
              (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)src_file_index * 4
                              ));
  if (*pCentral_dir_header != 0x2014b50) {
LAB_01b3588a:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar16 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  uVar1 = *(ushort *)(pCentral_dir_header + 8);
  local_560 = (ulong)*(ushort *)((long)pCentral_dir_header + 0x1e);
  uVar14 = (ulong)((uint)uVar1 + (uint)*(ushort *)(pCentral_dir_header + 7) +
                  (uint)*(ushort *)((long)pCentral_dir_header + 0x1e));
  if (((pArray->m_central_dir).m_size + uVar14) - 0xffffffb1 < 0xffffffff00000001)
  goto LAB_01b35641;
  n = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_01b358a2;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_01b358a2:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar8 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&src_file_stat,
                     (mz_bool *)0x0);
  local_5a8 = src_file_stat.m_local_header_ofs;
  if (mVar8 == 0) {
    return 0;
  }
  mVar19 = pZip->m_archive_size;
  sVar10 = (*pSource_zip->m_pRead)
                     (pSource_zip->m_pIO_opaque,src_file_stat.m_local_header_ofs,local_header_u32,
                      0x1e);
  if (sVar10 != 0x1e) goto LAB_01b35d51;
  if (local_header_u32[0] != 0x4034b50) goto LAB_01b3588a;
  uVar15 = (ulong)(ushort)local_header_u32[7];
  uVar21 = ((uint)local_header_u32[6]._2_2_ + (uint)(ushort)local_header_u32[7]) +
           src_file_stat.m_comp_size;
  if (((ushort)local_header_u32[7] == 0) ||
     ((local_header_u32._18_4_ != -1 && (local_header_u32._22_4_ != -1)))) {
    bVar22 = false;
  }
  else {
    local_528[0].m_capacity = 0;
    local_528[0].m_p._0_4_ = 0;
    local_528[0].m_p._4_4_ = 0;
    local_528[0].m_size._0_4_ = 0;
    local_528[0].m_size._4_1_ = 0;
    local_528[0].m_size._5_1_ = 0;
    local_528[0].m_size._6_1_ = 0;
    local_528[0].m_size._7_1_ = 0;
    local_528[0].m_element_size = 1;
    local_528[0]._28_4_ = 0;
    mVar8 = mz_zip_array_ensure_capacity(pZip,local_528,uVar15,0);
    if (mVar8 == 0) {
      mVar9 = MZ_ZIP_ALLOC_FAILED;
LAB_01b3597f:
      pZip->m_last_error = mVar9;
      return 0;
    }
    local_530 = (short *)CONCAT44(local_528[0].m_p._4_4_,local_528[0].m_p._0_4_);
    sVar10 = (*pSource_zip->m_pRead)
                       (pSource_zip->m_pIO_opaque,
                        local_header_u32[6]._2_2_ + src_file_stat.m_local_header_ofs + 0x1e,
                        local_530,uVar15);
    if (sVar10 != uVar15) {
      mVar9 = MZ_ZIP_FILE_READ_FAILED;
LAB_01b35973:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_530);
      goto LAB_01b3597f;
    }
    mVar9 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    psVar13 = local_530;
    do {
      uVar18 = (uint)uVar15;
      if (uVar18 < 4) goto LAB_01b35973;
      uVar17 = (ushort)psVar13[1] + 4;
      if (uVar18 < uVar17) goto LAB_01b35973;
      bVar22 = *psVar13 == 1;
      if (bVar22) {
        if ((ushort)psVar13[1] < 0x10) goto LAB_01b35973;
        break;
      }
      psVar13 = (short *)((long)psVar13 + (ulong)uVar17);
      uVar15 = (ulong)(uVar18 - uVar17);
    } while (uVar18 - uVar17 != 0);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_530);
  }
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe < (pArray->m_central_dir).m_size + uVar14 + n + mVar19 + uVar21 + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar8 = mz_zip_writer_write_zeros(pZip,mVar19,n);
  if (mVar8 == 0) {
    return 0;
  }
  mVar19 = mVar19 + n;
  sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar19,local_header_u32,0x1e);
  if (sVar10 != 0x1e) goto LAB_01b35f39;
  uVar15 = 0x10000;
  if (uVar21 < 0x10000) {
    uVar15 = uVar21;
  }
  sVar10 = 0x20;
  if (0x20 < uVar15) {
    sVar10 = uVar15;
  }
  piVar11 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar10);
  if (piVar11 == (int *)0x0) goto LAB_01b36139;
  local_5a8 = local_5a8 + 0x1e;
  local_588 = mVar19 + 0x1e;
  sVar10 = mVar19;
  for (; uVar21 != 0; uVar21 = uVar21 - sVar10) {
    sVar10 = 0x10000;
    if (uVar21 < 0x10000) {
      sVar10 = uVar21;
    }
    sVar12 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,local_5a8,piVar11,sVar10);
    if (sVar12 != sVar10) goto LAB_01b35d45;
    sVar12 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_588,piVar11,sVar10);
    if (sVar12 != sVar10) goto LAB_01b35f2d;
    local_5a8 = local_5a8 + sVar10;
    local_588 = local_588 + sVar10;
  }
  local_564 = (uint)sVar10;
  if ((local_header_u32[1]._2_1_ & 8) != 0) {
    if ((bool)(~bVar22 & pSource_zip->m_pState->m_zip64 == 0)) {
      sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,local_5a8,piVar11,0x10);
      if (sVar10 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_564 = (uint)(*piVar11 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar21 = (ulong)(*piVar11 == 0x8074b50);
          iVar2 = piVar11[uVar21];
          iVar3 = piVar11[uVar21 + 1];
          iVar4 = piVar11[uVar21 + 2];
          *piVar11 = 0x8074b50;
          *(char *)(piVar11 + 1) = (char)iVar2;
          *(char *)((long)piVar11 + 5) = (char)((uint)iVar2 >> 8);
          *(char *)((long)piVar11 + 6) = (char)((uint)iVar2 >> 0x10);
          *(char *)((long)piVar11 + 7) = (char)((uint)iVar2 >> 0x18);
          *(char *)(piVar11 + 2) = (char)iVar3;
          *(char *)((long)piVar11 + 9) = (char)((uint)iVar3 >> 8);
          *(char *)((long)piVar11 + 10) = (char)((uint)iVar3 >> 0x10);
          *(char *)((long)piVar11 + 0xb) = (char)((uint)iVar3 >> 0x18);
          piVar11[3] = 0;
          *(char *)(piVar11 + 4) = (char)iVar4;
          *(char *)((long)piVar11 + 0x11) = (char)((uint)iVar4 >> 8);
          *(char *)((long)piVar11 + 0x12) = (char)((uint)iVar4 >> 0x10);
          *(char *)((long)piVar11 + 0x13) = (char)((uint)iVar4 >> 0x18);
          piVar11[5] = 0;
          local_564 = 0x18;
        }
        goto LAB_01b35f03;
      }
    }
    else {
      sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,local_5a8,piVar11,0x18);
      if (sVar10 == 0x18) {
        local_564 = (uint)(*piVar11 == 0x8074b50) * 4 + 0x14;
LAB_01b35f03:
        uVar21 = (ulong)local_564;
        sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_588,piVar11,uVar21);
        if (sVar10 != uVar21) {
LAB_01b35f2d:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
LAB_01b35f39:
          pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
          return 0;
        }
        local_588 = local_588 + uVar21;
        goto LAB_01b35999;
      }
    }
LAB_01b35d45:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
LAB_01b35d51:
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
LAB_01b35999:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
  uVar21 = (pArray->m_central_dir).m_size;
  local_4b8 = *(undefined8 *)pCentral_dir_header;
  uStack_4b0 = *(undefined8 *)(pCentral_dir_header + 2);
  uVar7 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_498 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  uStack_4a8 = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_4a4 = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20);
  uStack_4a0 = (undefined4)uVar7;
  uStack_49c = (undefined2)((ulong)uVar7 >> 0x20);
  local_49a = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_492 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_588 >> 0x20 != 0) || (0xfffffffe < mVar19)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_492 = CONCAT44((int)mVar19,uStack_492);
    uVar16 = uVar21 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar16) &&
       (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar8 == 0))
    goto LAB_01b36139;
    (pArray->m_central_dir).m_size = uVar16;
    uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
    switchD_016b0717::default
              ((void *)(uVar21 * uVar16 + (long)(pArray->m_central_dir).m_p),&local_4b8,
               uVar16 * 0x2e);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar16 = uVar14 + sVar10;
    if ((uVar16 <= (pArray->m_central_dir).m_capacity) ||
       (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar8 != 0)) {
      (pArray->m_central_dir).m_size = uVar16;
      uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
      switchD_016b0717::default
                ((void *)(sVar10 * uVar16 + (long)(pArray->m_central_dir).m_p),
                 (void *)((long)pCentral_dir_header + 0x2e),uVar14 * uVar16);
LAB_01b3602c:
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
           (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,0), mVar8 != 0))
        {
          (pArray->m_central_dir).m_size = uVar21;
        }
LAB_01b35641:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_564 = (uint)uVar21;
      sVar10 = (pArray->m_central_dir_offsets).m_size;
      uVar16 = sVar10 + 1;
      if ((uVar16 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar16,1),
         mVar8 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar16;
        uVar16 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        switchD_016b0717::default
                  ((void *)(sVar10 * uVar16 + (long)(pArray->m_central_dir_offsets).m_p),&local_564,
                   uVar16);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_588;
        return 1;
      }
    }
    if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
       (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,0), mVar8 != 0)) {
      (pArray->m_central_dir).m_size = uVar21;
    }
LAB_01b36139:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  local_558.m_capacity = 0;
  local_558.m_p = (void *)0x0;
  local_558.m_size = 0;
  local_558._24_8_ = 1;
  local_4a4 = 0xffffffff;
  uStack_4a0 = 0xffffffff;
  _uStack_492 = CONCAT44(0xffffffff,uStack_492);
  mVar8 = mz_zip_array_ensure_capacity(pZip,&local_558,(ulong)((int)local_560 + 0x40),0);
  if (mVar8 == 0) {
LAB_01b35d84:
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
LAB_01b35d94:
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_558.m_p);
    return 0;
  }
  local_558.m_size = 0;
  local_528[0].m_p._4_4_ = (undefined4)src_file_stat.m_uncomp_size;
  local_528[0].m_size._0_4_ = (undefined4)(src_file_stat.m_uncomp_size >> 0x20);
  local_528[0].m_size._4_1_ = (undefined1)src_file_stat.m_comp_size;
  local_528[0].m_size._5_1_ = (undefined1)(src_file_stat.m_comp_size >> 8);
  local_528[0].m_size._6_1_ = (undefined1)(src_file_stat.m_comp_size >> 0x10);
  local_528[0].m_size._7_1_ = (undefined1)(src_file_stat.m_comp_size >> 0x18);
  local_528[0].m_capacity =
       CONCAT17((char)(mVar19 >> 0x18),
                CONCAT16((char)(mVar19 >> 0x10),
                         CONCAT15((char)(mVar19 >> 8),
                                  CONCAT14((char)mVar19,(int)(src_file_stat.m_comp_size >> 0x20)))))
  ;
  local_528[0].m_element_size = (mz_uint)(mVar19 >> 0x20);
  local_528[0].m_p._0_4_ = 0x180001;
  if ((local_558.m_capacity < 0x1c) &&
     (mVar8 = mz_zip_array_ensure_capacity(pZip,&local_558,0x1c,1), mVar8 == 0)) goto LAB_01b35d84;
  psVar13 = (short *)((long)pCentral_dir_header + uVar16 + 0x2e);
  local_558.m_size = 0x1c;
  local_578 = local_558.m_p;
  switchD_016b0717::default(local_558.m_p,local_528,(local_558._24_8_ & 0xffffffff) * 0x1c);
  if ((int)local_560 == 0) {
    uVar14 = 0x1c;
  }
  else {
    local_590 = 0x1c;
    local_598 = local_560 & 0xffffffff;
    __src = psVar13;
    do {
      if ((uint)local_598 < 4) {
LAB_01b35d8d:
        pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        goto LAB_01b35d94;
      }
      lVar20 = (ulong)(ushort)__src[1] + 4;
      if ((uint)local_598 < (uint)lVar20) goto LAB_01b35d8d;
      if (*__src != 1) {
        uVar14 = local_590 + lVar20;
        if (local_558.m_capacity < uVar14) {
          mVar8 = mz_zip_array_ensure_capacity(pZip,&local_558,uVar14,1);
          if (mVar8 == 0) goto LAB_01b35d84;
          local_578 = local_558.m_p;
        }
        local_558.m_size = uVar14;
        switchD_016b0717::default
                  ((void *)(local_590 * (local_558._24_8_ & 0xffffffff) + (long)local_578),__src,
                   (local_558._24_8_ & 0xffffffff) * lVar20);
        local_590 = uVar14;
      }
      __src = (short *)((long)__src + lVar20);
      uVar18 = (uint)local_598 - (uint)lVar20;
      local_598 = (ulong)uVar18;
      uVar14 = local_558.m_size;
    } while (uVar18 != 0);
  }
  local_49a = (undefined2)uVar14;
  sVar10 = (pArray->m_central_dir).m_size;
  uVar15 = sVar10 + 0x2e;
  if (((pArray->m_central_dir).m_capacity < uVar15) &&
     (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar15,1), mVar8 == 0)) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_558.m_p);
    goto LAB_01b36106;
  }
  (pArray->m_central_dir).m_size = uVar15;
  uVar15 = (ulong)(pArray->m_central_dir).m_element_size;
  switchD_016b0717::default
            ((void *)(sVar10 * uVar15 + (long)(pArray->m_central_dir).m_p),&local_4b8,uVar15 * 0x2e)
  ;
  sVar10 = (pArray->m_central_dir).m_size;
  uVar15 = uVar16 + sVar10;
  if ((pArray->m_central_dir).m_capacity < uVar15) {
    mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar15,1);
    local_580 = local_558.m_p;
    if (mVar8 != 0) goto LAB_01b35f4f;
  }
  else {
LAB_01b35f4f:
    local_580 = local_558.m_p;
    (pArray->m_central_dir).m_size = uVar15;
    uVar15 = (ulong)(pArray->m_central_dir).m_element_size;
    switchD_016b0717::default
              ((void *)(sVar10 * uVar15 + (long)(pArray->m_central_dir).m_p),
               (void *)((long)pCentral_dir_header + 0x2e),uVar16 * uVar15);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar16 = sVar10 + uVar14;
    if ((uVar16 <= (pArray->m_central_dir).m_capacity) ||
       (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar8 != 0)) {
      (pArray->m_central_dir).m_size = uVar16;
      uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
      switchD_016b0717::default
                ((void *)(sVar10 * uVar16 + (long)(pArray->m_central_dir).m_p),local_580,
                 uVar14 * uVar16);
      sVar10 = (pArray->m_central_dir).m_size;
      uVar16 = uVar1 + sVar10;
      if ((uVar16 <= (pArray->m_central_dir).m_capacity) ||
         (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,1), mVar8 != 0)) {
        (pArray->m_central_dir).m_size = uVar16;
        uVar16 = (ulong)(pArray->m_central_dir).m_element_size;
        switchD_016b0717::default
                  ((void *)(sVar10 * uVar16 + (long)(pArray->m_central_dir).m_p),
                   (void *)((long)psVar13 + (local_560 & 0xffffffff)),uVar1 * uVar16);
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_580);
        goto LAB_01b3602c;
      }
    }
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_580);
  if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
     (mVar8 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,0), mVar8 != 0)) {
    (pArray->m_central_dir).m_size = uVar21;
  }
LAB_01b36106:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32 *pSrc_descriptor = (const mz_uint32 *)((const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}